

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QString * __thiscall
QAccessibleTextWidget::text(QAccessibleTextWidget *this,int startOffset,int endOffset)

{
  MoveMode in_ECX;
  MoveMode in_EDX;
  long *in_RSI;
  int iVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QString *in_stack_ffffffffffffff88;
  QChar local_2c;
  QChar local_2a;
  undefined1 local_28 [24];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RSI + 0x158))();
  iVar1 = (int)(QTextCursor *)&local_10;
  QTextCursor::setPosition(iVar1,in_EDX);
  QTextCursor::setPosition(iVar1,in_ECX);
  QTextCursor::selectedText();
  QChar::QChar<QChar::SpecialCharacter,_true>(&local_2a,ParagraphSeparator);
  QChar::QChar<char16_t,_true>(&local_2c,L'\n');
  QString::replace((QChar *)local_28,(QChar *)(ulong)(ushort)local_2a.ucs,(uint)(ushort)local_2c.ucs
                  );
  QString::QString(in_RDI,in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x7e8287);
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTextWidget::text(int startOffset, int endOffset) const
{
    QTextCursor cursor(textCursor());

    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);

    return cursor.selectedText().replace(QChar(QChar::ParagraphSeparator), u'\n');
}